

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O0

uint64_t __thiscall
MILBlob::Blob::StorageWriter::Impl::WriteData<unsigned_char>
          (Impl *this,Span<const_unsigned_char,_18446744073709551615UL> data)

{
  pointer pFVar1;
  runtime_error *prVar2;
  SpanSize<18446744073709551615UL> extraout_RDX;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<unsigned_char,_18446744073709551615UL> local_f0;
  Span<const_unsigned_char,_18446744073709551615UL> local_e0;
  Impl *local_d0;
  pointer local_c8;
  Span<const_unsigned_char,_18446744073709551615UL> local_c0;
  uint64_t local_b0;
  uint64_t actualDataOffset;
  Span<const_unsigned_char,_18446744073709551615UL> local_98;
  uint64_t local_88;
  uint64_t actualMetadataOffset;
  ulong local_70;
  unsigned_long dataOffset;
  uint64_t metadataOffset;
  blob_metadata metadata;
  Impl *this_local;
  Span<const_unsigned_char,_18446744073709551615UL> data_local;
  
  data_local.m_ptr = (pointer)data.m_size.m_size;
  this_local = (Impl *)data.m_ptr;
  metadata.reserved_4 = (uint64_t)this;
  blob_metadata::blob_metadata((blob_metadata *)&metadataOffset);
  metadataOffset._4_4_ = 3;
  metadata._0_8_ =
       Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                 ((Span<const_unsigned_char,_18446744073709551615UL> *)&this_local);
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  dataOffset = FileWriter::GetNextAlignedOffset(pFVar1);
  local_70 = dataOffset + 0x40;
  if ((local_70 & 0x3f) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  metadata.sizeInBytes = local_70;
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  _actualDataOffset =
       anon_unknown.dwarf_560e6::CastAndMakeSpan<MILBlob::Blob::blob_metadata>
                 ((blob_metadata *)&metadataOffset);
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_98,(Span<unsigned_char,_18446744073709551615UL> *)&actualDataOffset);
  local_88 = FileWriter::AppendData(pFVar1,local_98);
  if (dataOffset != local_88) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: Metadata written to different offset than expected.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  local_d0 = this_local;
  local_c8 = data_local.m_ptr;
  span.m_size.m_size = extraout_RDX.m_size;
  span.m_ptr = data_local.m_ptr;
  local_c0 = Util::SpanCast<unsigned_char_const,unsigned_char_const>((Util *)this_local,span);
  local_b0 = FileWriter::AppendData(pFVar1,local_c0);
  if (local_70 != local_b0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: Metadata written to different offset than expected.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->m_header).count = (this->m_header).count + 1;
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  local_f0 = anon_unknown.dwarf_560e6::CastAndMakeSpan<MILBlob::Blob::storage_header>
                       (&this->m_header);
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_e0,&local_f0);
  FileWriter::WriteData(pFVar1,local_e0,0);
  return dataOffset;
}

Assistant:

uint64_t StorageWriter::Impl::WriteData(Util::Span<const T> data)
{
    // 1. Write data
    blob_metadata metadata;
    metadata.mil_dtype = BlobDataTypeTraits<typename std::remove_const<T>::type>::DataType;
    metadata.sizeInBytes = data.Size() * sizeof(T);
    // Get offset for data
    auto metadataOffset = m_fileWriter->GetNextAlignedOffset();
    // metadata is 64 bit aligned.
    auto dataOffset = metadataOffset + sizeof(metadata);
    MILVerifyIsTrue(dataOffset % DefaultStorageAlignment == 0,
                    std::runtime_error,
                    "[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
    metadata.offset = dataOffset;
    // We don't expect m_fileWriter to produce different offset for metadata and data
    auto actualMetadataOffset = m_fileWriter->AppendData(CastAndMakeSpan(metadata));
    MILVerifyIsTrue(metadataOffset == actualMetadataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");
    auto actualDataOffset = m_fileWriter->AppendData(Util::SpanCast<const uint8_t>(data));
    MILVerifyIsTrue(dataOffset == actualDataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");

    // 2. Update count in header
    m_header.count++;
    // Write header with new count
    m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
    // return offset in file to blob_metadata
    return metadataOffset;
}